

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_transaction_common.cpp
# Opt level: O0

void __thiscall cfd::SignParameter::SignParameter(SignParameter *this,ScriptOperator *op_code)

{
  value_type vVar1;
  ScriptType SVar2;
  reference pvVar3;
  ScriptOperator *in_RSI;
  ByteData *in_RDI;
  vector<unsigned_char,_std::allocator<unsigned_char>_> list;
  undefined7 in_stack_ffffffffffffff68;
  vector *this_00;
  allocator_type *__a;
  ScriptOperator *this_01;
  ByteData *this_02;
  ByteData local_58;
  allocator_type local_39;
  vector local_38 [40];
  ScriptOperator *local_10;
  
  this_02 = in_RDI;
  local_10 = in_RSI;
  cfd::core::ByteData::ByteData(in_RDI);
  *(undefined4 *)
   &in_RDI[1].data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = 4;
  cfd::core::Pubkey::Pubkey
            ((Pubkey *)
             &in_RDI[1].data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_finish);
  *(undefined1 *)
   &this_02[2].data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = 0;
  cfd::core::SigHashType::SigHashType
            ((SigHashType *)
             ((long)&this_02[2].data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_finish + 4));
  this_01 = (ScriptOperator *)(this_02 + 3);
  cfd::core::ScriptOperator::ScriptOperator(this_01,local_10);
  __a = &local_39;
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x394ccd);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&this_02->data_,(size_type)this_01,__a);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x394ced);
  SVar2 = core::ScriptOperator::GetDataType((ScriptOperator *)(this_02 + 3));
  vVar1 = (value_type)SVar2;
  this_00 = local_38;
  pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_00,0);
  *pvVar3 = vVar1;
  cfd::core::ByteData::ByteData(&local_58,this_00);
  core::ByteData::operator=
            ((ByteData *)this_00,(ByteData *)CONCAT17(vVar1,in_stack_ffffffffffffff68));
  core::ByteData::~ByteData((ByteData *)0x394d4c);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)__a);
  return;
}

Assistant:

SignParameter::SignParameter(const ScriptOperator& op_code)
    : data_(),
      data_type_(SignDataType::kOpCode),
      related_pubkey_(),
      der_encode_(false),
      sighash_type_(),
      op_code_(op_code) {
  std::vector<uint8_t> list(1);
  list[0] = static_cast<uint8_t>(op_code_.GetDataType());
  data_ = ByteData(list);
}